

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

Aig_Man_t *
Dar_ManCompress2(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fFanout,int fPower,int fVerbose)

{
  Aig_Man_t *pAVar1;
  Dar_RefPar_t *pParsRef;
  Dar_RefPar_t ParsRef;
  Dar_RwrPar_t *pParsRwr;
  Dar_RwrPar_t ParsRwr;
  Aig_Man_t *pTemp;
  int fVerbose_local;
  int fPower_local;
  int fFanout_local;
  int fUpdateLevel_local;
  int fBalance_local;
  Aig_Man_t *pAig_local;
  
  ParsRef._24_8_ = (long)&pParsRwr + 4;
  Dar_ManDefaultRwrParams((Dar_RwrPar_t *)ParsRef._24_8_);
  Dar_ManDefaultRefParams((Dar_RefPar_t *)&pParsRef);
  *(int *)(ParsRef._24_8_ + 0xc) = fUpdateLevel;
  ParsRef.nCutsMax = fUpdateLevel;
  *(int *)(ParsRef._24_8_ + 8) = fFanout;
  *(int *)(ParsRef._24_8_ + 0x14) = fPower;
  *(undefined4 *)(ParsRef._24_8_ + 0x1c) = 0;
  ParsRef.fUpdateLevel = 0;
  pAVar1 = Aig_ManDupDfs(pAig);
  if (fVerbose != 0) {
    printf("Starting:  ");
    Aig_ManPrintStats(pAVar1);
  }
  *(undefined4 *)(ParsRef._24_8_ + 0xc) = 0;
  Dar_ManRewrite(pAVar1,(Dar_RwrPar_t *)ParsRef._24_8_);
  *(int *)(ParsRef._24_8_ + 0xc) = fUpdateLevel;
  ParsRwr._28_8_ = pAVar1;
  pAVar1 = Aig_ManDupDfs(pAVar1);
  Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
  if (fVerbose != 0) {
    printf("Rewrite:   ");
    Aig_ManPrintStats(pAVar1);
  }
  Dar_ManRefactor(pAVar1,(Dar_RefPar_t *)&pParsRef);
  ParsRwr._28_8_ = pAVar1;
  pAVar1 = Aig_ManDupDfs(pAVar1);
  Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
  if (fVerbose != 0) {
    printf("Refactor:  ");
    Aig_ManPrintStats(pAVar1);
  }
  ParsRwr._28_8_ = pAVar1;
  pAVar1 = Dar_ManBalance(pAVar1,fUpdateLevel);
  Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
  if (fVerbose != 0) {
    printf("Balance:   ");
    Aig_ManPrintStats(pAVar1);
  }
  Dar_ManRewrite(pAVar1,(Dar_RwrPar_t *)ParsRef._24_8_);
  ParsRwr._28_8_ = pAVar1;
  pAVar1 = Aig_ManDupDfs(pAVar1);
  Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
  if (fVerbose != 0) {
    printf("Rewrite:   ");
    Aig_ManPrintStats(pAVar1);
  }
  *(undefined4 *)(ParsRef._24_8_ + 0x10) = 1;
  ParsRef.fExtend = 1;
  Dar_ManRewrite(pAVar1,(Dar_RwrPar_t *)ParsRef._24_8_);
  ParsRwr._28_8_ = pAVar1;
  _fUpdateLevel_local = Aig_ManDupDfs(pAVar1);
  Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
  if (fVerbose != 0) {
    printf("RewriteZ:  ");
    Aig_ManPrintStats(_fUpdateLevel_local);
  }
  if (fBalance != 0) {
    ParsRwr._28_8_ = _fUpdateLevel_local;
    _fUpdateLevel_local = Dar_ManBalance(_fUpdateLevel_local,fUpdateLevel);
    Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
    if (fVerbose != 0) {
      printf("Balance:   ");
      Aig_ManPrintStats(_fUpdateLevel_local);
    }
  }
  Dar_ManRefactor(_fUpdateLevel_local,(Dar_RefPar_t *)&pParsRef);
  ParsRwr._28_8_ = _fUpdateLevel_local;
  pAVar1 = Aig_ManDupDfs(_fUpdateLevel_local);
  Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
  if (fVerbose != 0) {
    printf("RefactorZ: ");
    Aig_ManPrintStats(pAVar1);
  }
  Dar_ManRewrite(pAVar1,(Dar_RwrPar_t *)ParsRef._24_8_);
  ParsRwr._28_8_ = pAVar1;
  _fUpdateLevel_local = Aig_ManDupDfs(pAVar1);
  Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
  if (fVerbose != 0) {
    printf("RewriteZ:  ");
    Aig_ManPrintStats(_fUpdateLevel_local);
  }
  if (fBalance != 0) {
    ParsRwr._28_8_ = _fUpdateLevel_local;
    _fUpdateLevel_local = Dar_ManBalance(_fUpdateLevel_local,fUpdateLevel);
    Aig_ManStop((Aig_Man_t *)ParsRwr._28_8_);
    if (fVerbose != 0) {
      printf("Balance:   ");
      Aig_ManPrintStats(_fUpdateLevel_local);
    }
  }
  return _fUpdateLevel_local;
}

Assistant:

Aig_Man_t * Dar_ManCompress2( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fFanout, int fPower, int fVerbose )
//alias compress2   "b -l; rw -l; rf -l; b -l; rw -l; rwz -l; b -l; rfz -l; rwz -l; b -l"
{
    Aig_Man_t * pTemp;

    Dar_RwrPar_t ParsRwr, * pParsRwr = &ParsRwr;
    Dar_RefPar_t ParsRef, * pParsRef = &ParsRef;

    Dar_ManDefaultRwrParams( pParsRwr );
    Dar_ManDefaultRefParams( pParsRef );

    pParsRwr->fUpdateLevel = fUpdateLevel;
    pParsRef->fUpdateLevel = fUpdateLevel;
    pParsRwr->fFanout = fFanout;
    pParsRwr->fPower = fPower;

    pParsRwr->fVerbose = 0;//fVerbose;
    pParsRef->fVerbose = 0;//fVerbose;

    pAig = Aig_ManDupDfs( pAig ); 
    if ( fVerbose ) printf( "Starting:  " ), Aig_ManPrintStats( pAig );
/*
    // balance
    if ( fBalance )
    {
    pAig = Dar_ManBalance( pTemp = pAig, fUpdateLevel );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    }
*/
    // rewrite
//    Dar_ManRewrite( pAig, pParsRwr );
    pParsRwr->fUpdateLevel = 0;  // disable level update
    Dar_ManRewrite( pAig, pParsRwr );
    pParsRwr->fUpdateLevel = fUpdateLevel;  // reenable level update if needed

    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    
    // refactor
    Dar_ManRefactor( pAig, pParsRef );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Refactor:  " ), Aig_ManPrintStats( pAig );

    // balance
//    if ( fBalance )
    {
    pAig = Dar_ManBalance( pTemp = pAig, fUpdateLevel );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    }
    
    // rewrite
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );

    pParsRwr->fUseZeros = 1;
    pParsRef->fUseZeros = 1;
    
    // rewrite
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "RewriteZ:  " ), Aig_ManPrintStats( pAig );

    // balance
    if ( fBalance )
    {
    pAig = Dar_ManBalance( pTemp = pAig, fUpdateLevel );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    }
    
    // refactor
    Dar_ManRefactor( pAig, pParsRef );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "RefactorZ: " ), Aig_ManPrintStats( pAig );
    
    // rewrite
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "RewriteZ:  " ), Aig_ManPrintStats( pAig );

    // balance
    if ( fBalance )
    {
    pAig = Dar_ManBalance( pTemp = pAig, fUpdateLevel );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    }
    return pAig;
}